

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint check_better_fast(MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,MV *best_mv,
                      SubpelMvLimits *mv_limits,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                      MV_COST_PARAMS *mv_cost_params,uint *besterr,uint *sse1,int *distortion,
                      int *has_better_mv,int is_scaled)

{
  int iVar1;
  MV *in_RCX;
  MV *in_RDX;
  SubpelMvLimits *in_R8;
  int thismse;
  uint sse;
  uint cost;
  uint *in_stack_0000c0c0;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_0000c0c8;
  MV *in_stack_0000c0d0;
  AV1_COMMON *in_stack_0000c0d8;
  MACROBLOCKD *in_stack_0000c0e0;
  MV *in_stack_ffffffffffffffb8;
  int local_3c;
  undefined4 local_38;
  uint local_34;
  
  iVar1 = av1_is_subpelmv_in_range(in_R8,*in_RDX);
  if (iVar1 == 0) {
    local_34 = 0x7fffffff;
  }
  else {
    if ((int)this_mv == 0) {
      local_3c = estimated_pref_error(this_mv,(SUBPEL_SEARCH_VAR_PARAMS *)best_mv,(uint *)mv_limits)
      ;
    }
    else {
      local_3c = upsampled_pref_error
                           (in_stack_0000c0e0,in_stack_0000c0d8,in_stack_0000c0d0,in_stack_0000c0c8,
                            in_stack_0000c0c0);
    }
    iVar1 = mv_err_cost_(in_stack_ffffffffffffffb8,(MV_COST_PARAMS *)0x25e5bb);
    local_34 = local_3c + iVar1;
    if (local_34 < *_sse) {
      *_sse = local_34;
      *in_RCX = *in_RDX;
      mv_limits->col_min = local_3c;
      *(undefined4 *)&var_params->vfp = local_38;
      *best_mv = (MV)((uint)*best_mv | 1);
    }
  }
  return local_34;
}

Assistant:

static inline unsigned int check_better_fast(
    MACROBLOCKD *xd, const AV1_COMMON *cm, const MV *this_mv, MV *best_mv,
    const SubpelMvLimits *mv_limits, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *besterr,
    unsigned int *sse1, int *distortion, int *has_better_mv, int is_scaled) {
  unsigned int cost;
  if (av1_is_subpelmv_in_range(mv_limits, *this_mv)) {
    unsigned int sse;
    int thismse;
    if (is_scaled) {
      thismse = upsampled_pref_error(xd, cm, this_mv, var_params, &sse);
    } else {
      thismse = estimated_pref_error(this_mv, var_params, &sse);
    }
    cost = mv_err_cost_(this_mv, mv_cost_params);
    cost += thismse;

    if (cost < *besterr) {
      *besterr = cost;
      *best_mv = *this_mv;
      *distortion = thismse;
      *sse1 = sse;
      *has_better_mv |= 1;
    }
  } else {
    cost = INT_MAX;
  }
  return cost;
}